

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ProfiledNewScFltArray
              (AuxArray<double> *doubles,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  code *pcVar1;
  bool bVar2;
  ThreadContext *threadContext;
  JavascriptLibrary *pJVar3;
  SparseArraySegmentBase **ppSVar4;
  undefined4 *puVar5;
  Var pvVar6;
  int32 local_9c;
  AuxArray<double> AStack_98;
  int32 ival;
  double dval;
  SparseArraySegment<void_*> *pSStack_88;
  uint i;
  SparseArraySegment<void_*> *head;
  JavascriptArray *arr;
  uint32 count;
  SparseArraySegment<double> *head_1;
  JavascriptNativeFloatArray *arr_1;
  uint32 count_1;
  undefined1 local_50 [8];
  JsReentLock reentrancylock;
  RecyclerWeakReference<Js::FunctionBody> *weakFuncRef_local;
  ArrayCallSiteInfo *arrayInfo_local;
  ScriptContext *scriptContext_local;
  AuxArray<double> *doubles_local;
  
  reentrancylock._24_8_ = weakFuncRef;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  bVar2 = ArrayCallSiteInfo::IsNativeFloatArray(arrayInfo);
  if (bVar2) {
    ArrayCallSiteInfo::SetIsNotNativeIntArray(arrayInfo);
    arr_1._0_4_ = doubles->count;
    pJVar3 = ScriptContext::GetLibrary(scriptContext);
    head_1 = (SparseArraySegment<double> *)
             JavascriptLibrary::CreateNativeFloatArrayLiteral(pJVar3,(uint32)arr_1);
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)
                         &(((JavascriptNativeFloatArray *)head_1)->super_JavascriptNativeArray).
                          super_JavascriptArray.head);
    _count = SparseArraySegment<double>::From(*ppSVar4);
    if (((uint32)arr_1 == 0) || ((uint32)arr_1 != (_count->super_SparseArraySegmentBase).length)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x434,"(count > 0 && count == head->length)",
                                  "count > 0 && count == head->length");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    Memory::CopyArray<double,double,Memory::Recycler>
              ((double *)(_count + 1),(ulong)(_count->super_SparseArraySegmentBase).length,
               (double *)(doubles + 1),(ulong)(uint32)arr_1);
    JavascriptNativeArray::SetArrayProfileInfo
              ((JavascriptNativeArray *)head_1,
               (RecyclerWeakReference<Js::FunctionBody> *)reentrancylock._24_8_,arrayInfo);
    doubles_local = (AuxArray<double> *)head_1;
  }
  else {
    arr._0_4_ = doubles->count;
    pJVar3 = ScriptContext::GetLibrary(scriptContext);
    head = (SparseArraySegment<void_*> *)JavascriptLibrary::CreateArrayLiteral(pJVar3,(uint32)arr);
    ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&((JavascriptArray *)head)->head);
    pSStack_88 = SparseArraySegment<void_*>::From(*ppSVar4);
    if (((uint32)arr == 0) || ((uint32)arr != (pSStack_88->super_SparseArraySegmentBase).length)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x43e,"(count > 0 && count == head->length)",
                                  "count > 0 && count == head->length");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    for (dval._4_4_ = 0; dval._4_4_ < (uint32)arr; dval._4_4_ = dval._4_4_ + 1) {
      AStack_98 = doubles[(ulong)dval._4_4_ + 1];
      bVar2 = JavascriptNumber::TryGetInt32Value<false>((double)AStack_98,&local_9c);
      if ((!bVar2) || (bVar2 = TaggedInt::IsOverflow(local_9c), bVar2)) {
        pvVar6 = JavascriptNumber::ToVarNoCheck((double)AStack_98,scriptContext);
        Memory::WriteBarrierPtr<void>::operator=
                  ((WriteBarrierPtr<void> *)
                   (&pSStack_88[1].super_SparseArraySegmentBase.left + (ulong)dval._4_4_ * 2),pvVar6
                  );
      }
      else {
        pvVar6 = TaggedInt::ToVarUnchecked(local_9c);
        Memory::WriteBarrierPtr<void>::operator=
                  ((WriteBarrierPtr<void> *)
                   (&pSStack_88[1].super_SparseArraySegmentBase.left + (ulong)dval._4_4_ * 2),pvVar6
                  );
      }
    }
    doubles_local = (AuxArray<double> *)head;
  }
  arr._4_4_ = 1;
  JsReentLock::~JsReentLock((JsReentLock *)local_50);
  return doubles_local;
}

Assistant:

Var JavascriptArray::ProfiledNewScFltArray(AuxArray<double> *doubles, ScriptContext* scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScFltArray, reentrancylock, scriptContext->GetThreadContext());
        // Called only to create array literals: size is known.
        if (arrayInfo->IsNativeFloatArray())
        {
            arrayInfo->SetIsNotNativeIntArray();
            uint32 count = doubles->count;
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(count);
            SparseArraySegment<double> *head = SparseArraySegment<double>::From(arr->head);
            Assert(count > 0 && count == head->length);
            CopyArray(head->elements, head->length, doubles->elements, count);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);

            return arr;
        }

        uint32 count = doubles->count;
        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(count);
        SparseArraySegment<Var> *head = SparseArraySegment<Var>::From(arr->head);
        Assert(count > 0 && count == head->length);

        for (uint i = 0; i < count; i++)
        {
            double dval = doubles->elements[i];
            int32 ival;
            if (JavascriptNumber::TryGetInt32Value(dval, &ival) && !TaggedInt::IsOverflow(ival))
            {
                head->elements[i] = TaggedInt::ToVarUnchecked(ival);
            }
            else
            {
                head->elements[i] = JavascriptNumber::ToVarNoCheck(dval, scriptContext);
            }
        }

        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScFltArray);
    }